

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

bool __thiscall
docopt::LeafPattern::match
          (LeafPattern *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  Kind KVar1;
  element_type *peVar2;
  element_type *peVar3;
  __normal_iterator<std::shared_ptr<docopt::LeafPattern>_*,_std::vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>_>
  _Var4;
  long lVar5;
  string *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  value *pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  long local_c8;
  value_type local_c0;
  value local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_Pattern)._vptr_Pattern[8])(&local_c8,this,left);
  peVar3 = local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) goto LAB_0013f8a6;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::erase(left,(left->
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               )._M_impl.super__Vector_impl_data._M_start + local_c8);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::LeafPattern>*,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>>,__gnu_cxx::__ops::_Iter_pred<docopt::LeafPattern::match(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>&,std::vector<std::shared_ptr<docopt::LeafPattern>,std::allocator<std::shared_ptr<docopt::LeafPattern>>>&)const::_lambda(std::shared_ptr<docopt::LeafPattern>const&)_1_>>
                    ((collected->
                     super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (collected->
                     super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,this);
  KVar1 = (this->fValue).kind_;
  if (KVar1 != StringList) {
    if (KVar1 != Long) {
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::push_back(collected,&local_c0);
      goto LAB_0013f8a6;
    }
    if (_Var4._M_current ==
        (collected->
        super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::push_back(collected,&local_c0);
      local_b0.variant_.longValue = 1;
LAB_0013f74d:
      pvVar7 = &(local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->fValue;
    }
    else {
      peVar2 = ((_Var4._M_current)->
               super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pvVar7 = &peVar2->fValue;
      if ((peVar2->fValue).kind_ == Long) {
        lVar5 = value::asLong(pvVar7);
        local_b0.variant_.strList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(lVar5 + 1);
        local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((_Var4._M_current)->
             super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        goto LAB_0013f74d;
      }
      local_b0.variant_.longValue = 1;
    }
    local_b0.kind_ = Long;
    value::operator=(pvVar7,&local_b0);
    value::~value(&local_b0);
    goto LAB_0013f8a6;
  }
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KVar1 = ((local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          fValue).kind_;
  if (KVar1 == StringList) {
    pvVar6 = value::asStringList_abi_cxx11_
                       (&(local_c0.
                          super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->fValue);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_e8,pvVar6);
  }
  else if (KVar1 == String) {
    __x = value::asString_abi_cxx11_
                    (&(local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->fValue);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e8,__x);
  }
  if (_Var4._M_current ==
      (collected->
      super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::push_back(collected,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&local_e8);
    pvVar6 = &local_48;
LAB_0013f7f4:
    local_b0.kind_ = StringList;
    local_b0.variant_.longValue =
         (long)(pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_b0.variant_.strValue._M_string_length =
         (size_type)
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_b0.variant_.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pvVar6->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value::operator=(&(local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->fValue,&local_b0);
  }
  else {
    peVar2 = ((_Var4._M_current)->
             super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pvVar7 = &peVar2->fValue;
    if ((peVar2->fValue).kind_ == StringList) {
      pvVar6 = value::asStringList_abi_cxx11_(pvVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
                 (const_iterator)
                 local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      peVar2 = ((_Var4._M_current)->
               super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,&local_e8);
      pvVar6 = &local_68;
      local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      goto LAB_0013f7f4;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,&local_e8);
    local_b0.kind_ = StringList;
    pvVar6 = &local_88;
    local_b0.variant_.longValue =
         (long)local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_b0.variant_.strValue._M_string_length =
         (size_type)
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b0.variant_.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value::operator=(pvVar7,&local_b0);
  }
  value::~value(&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
LAB_0013f8a6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return peVar3 != (element_type *)0x0;
}

Assistant:

inline bool LeafPattern::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
	{
		auto match = single_match(left);
		if (!match.second) {
			return false;
		}

		left.erase(left.begin()+static_cast<std::ptrdiff_t>(match.first));

		auto same_name = std::find_if(collected.begin(), collected.end(), [&](std::shared_ptr<LeafPattern> const& p) {
			return p->name()==name();
		});
		if (getValue().isLong()) {
			long val = 1;
			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isLong()) {
				val += (**same_name).getValue().asLong();
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else if (getValue().isStringList()) {
			std::vector<std::string> val;
			if (match.second->getValue().isString()) {
				val.push_back(match.second->getValue().asString());
			} else if (match.second->getValue().isStringList()) {
				val = match.second->getValue().asStringList();
			} else {
				/// cant be!?
			}

			if (same_name == collected.end()) {
				collected.push_back(match.second);
				match.second->setValue(value{val});
			} else if ((**same_name).getValue().isStringList()) {
				std::vector<std::string> const& list = (**same_name).getValue().asStringList();
				val.insert(val.begin(), list.begin(), list.end());
				(**same_name).setValue(value{val});
			} else {
				(**same_name).setValue(value{val});
			}
		} else {
			collected.push_back(match.second);
		}
		return true;
	}